

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  byte *z;
  char cVar2;
  int iVar3;
  int iVar4;
  Unicode61Tokenizer *p;
  char *pcVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  u16 *puVar9;
  uint uVar10;
  char *pcVar11;
  
  if ((nArg & 1U) != 0) {
    return 1;
  }
  iVar3 = sqlite3_initialize();
  iVar4 = 7;
  if ((iVar3 == 0) &&
     (p = (Unicode61Tokenizer *)sqlite3Malloc(0xc0), p != (Unicode61Tokenizer *)0x0)) {
    memset(p,0,0xc0);
    p->nFold = 0x40;
    p->eRemoveDiacritic = 1;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      pcVar5 = (char *)sqlite3Malloc(0x40);
      p->aFold = pcVar5;
      pcVar11 = "L* N* Co";
      if (0 < nArg && pcVar5 != (char *)0x0) {
        lVar6 = 0;
LAB_001d756b:
        if (azArg[lVar6] != (char *)0x0) {
          lVar7 = 0;
          do {
            bVar1 = azArg[lVar6][lVar7];
            if (bVar1 == "categories"[lVar7]) {
              if ((ulong)bVar1 == 0) goto LAB_001d759c;
            }
            else if (""[bVar1] != ""[(byte)"categories"[lVar7]]) break;
            lVar7 = lVar7 + 1;
          } while( true );
        }
        goto LAB_001d75a1;
      }
LAB_001d75a9:
      if (pcVar5 != (char *)0x0) {
        cVar2 = *pcVar11;
        if (cVar2 != '\0') {
LAB_001d75c1:
          do {
            if (cVar2 != '\0') {
              if ((cVar2 == ' ') || (cVar2 == '\t')) {
                cVar2 = pcVar11[1];
                pcVar11 = pcVar11 + 1;
                goto LAB_001d75c1;
              }
              iVar4 = sqlite3Fts5UnicodeCatParse(pcVar11,p->aCategory);
              if (iVar4 != 0) {
                iVar4 = 1;
                goto LAB_001d74cc;
              }
            }
            while( true ) {
              cVar2 = *pcVar11;
              if (cVar2 == '\0') goto LAB_001d7606;
              if ((cVar2 == '\t') || (cVar2 == ' ')) break;
              pcVar11 = pcVar11 + 1;
            }
          } while( true );
        }
LAB_001d7606:
        uVar8 = 0;
        puVar9 = aFts5UnicodeData;
        do {
          uVar10 = (*puVar9 >> 5) + uVar8;
          if (0x7f < (int)uVar10) {
            uVar10 = 0x80;
          }
          if ((int)uVar8 < (int)uVar10) {
            memset(p->aTokenChar + (int)uVar8,(uint)p->aCategory[*puVar9 & 0x1f],
                   (ulong)(~uVar8 + uVar10) + 1);
            uVar8 = uVar10;
          }
          puVar9 = puVar9 + 1;
        } while ((int)uVar8 < 0x80);
        if (0 < nArg) {
          lVar6 = 0;
          iVar4 = 1;
LAB_001d769b:
          pcVar11 = azArg[lVar6];
          if (pcVar11 != (char *)0x0) {
            z = (byte *)azArg[lVar6 + 1];
            lVar7 = 0;
            do {
              bVar1 = pcVar11[lVar7];
              if (bVar1 == "remove_diacritics"[lVar7]) {
                if ((ulong)bVar1 == 0) goto LAB_001d76d2;
              }
              else if (""[bVar1] != ""[(byte)"remove_diacritics"[lVar7]]) {
                lVar7 = 0;
                goto LAB_001d76fb;
              }
              lVar7 = lVar7 + 1;
            } while( true );
          }
          goto LAB_001d74cc;
        }
        iVar4 = 0;
        goto LAB_001d74d7;
      }
    }
    else {
      p->aFold = (char *)0x0;
    }
  }
  else {
    p = (Unicode61Tokenizer *)0x0;
  }
LAB_001d74cc:
  fts5UnicodeDelete((Fts5Tokenizer *)p);
  p = (Unicode61Tokenizer *)0x0;
LAB_001d74d7:
  *ppOut = (Fts5Tokenizer *)p;
  return iVar4;
LAB_001d759c:
  pcVar11 = azArg[lVar6 + 1];
LAB_001d75a1:
  lVar6 = lVar6 + 2;
  if (nArg <= (int)lVar6) goto LAB_001d75a9;
  goto LAB_001d756b;
LAB_001d76fb:
  bVar1 = pcVar11[lVar7];
  if (bVar1 == "tokenchars"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001d771f;
  }
  else if (""[bVar1] != ""[(byte)"tokenchars"[lVar7]]) {
    lVar7 = 0;
    goto LAB_001d772b;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001d76fb;
LAB_001d772b:
  bVar1 = pcVar11[lVar7];
  if (bVar1 == "separators"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001d774f;
  }
  else if (""[bVar1] != ""[(byte)"separators"[lVar7]]) {
    lVar7 = 0;
    goto LAB_001d778d;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001d772b;
LAB_001d778d:
  bVar1 = pcVar11[lVar7];
  if (bVar1 == "categories"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001d76f5;
  }
  else if (""[bVar1] != ""[(byte)"categories"[lVar7]]) goto LAB_001d74cc;
  lVar7 = lVar7 + 1;
  goto LAB_001d778d;
LAB_001d774f:
  iVar3 = 0;
  goto LAB_001d7754;
LAB_001d771f:
  iVar3 = 1;
LAB_001d7754:
  iVar3 = fts5UnicodeAddExceptions(p,(char *)z,iVar3);
LAB_001d7778:
  if ((iVar3 != 0) || (lVar6 = lVar6 + 2, nArg <= (int)lVar6)) goto LAB_001d77cb;
  goto LAB_001d769b;
LAB_001d76d2:
  if ((2 < (byte)(*z - 0x30)) || (z[1] != 0)) goto LAB_001d74cc;
  p->eRemoveDiacritic = *z - 0x30;
LAB_001d76f5:
  iVar3 = 0;
  goto LAB_001d7778;
LAB_001d77cb:
  iVar4 = iVar3;
  if (iVar3 == 0) {
    iVar4 = 0;
    goto LAB_001d74d7;
  }
  goto LAB_001d74cc;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */ 

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }

      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }

    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}